

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall
TasGrid::GridGlobal::evaluateBatchGPUtempl<double>
          (GridGlobal *this,double *gpu_x,int cpu_num_x,double *gpu_y)

{
  int iVar1;
  AccelerationContext *pAVar2;
  int iVar3;
  double *pdVar4;
  unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
  *this_00;
  pointer pCVar5;
  undefined1 local_40 [8];
  GpuVector<double> gpu_basis;
  int num_points;
  double *gpu_y_local;
  int cpu_num_x_local;
  double *gpu_x_local;
  GridGlobal *this_local;
  
  loadGpuValues<double>(this);
  gpu_basis.gpu_data._4_4_ = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  GpuVector<double>::GpuVector
            ((GpuVector<double> *)local_40,(this->super_BaseCanonicalGrid).acceleration,cpu_num_x,
             gpu_basis.gpu_data._4_4_);
  pdVar4 = GpuVector<double>::data((GpuVector<double> *)local_40);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x16])
            (this,gpu_x,(ulong)(uint)cpu_num_x,pdVar4);
  iVar3 = gpu_basis.gpu_data._4_4_;
  pAVar2 = (this->super_BaseCanonicalGrid).acceleration;
  iVar1 = (this->super_BaseCanonicalGrid).num_outputs;
  this_00 = getGpuCache<double>(this);
  pCVar5 = ::std::
           unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
           ::operator->(this_00);
  TasGpu::denseMultiply<double>
            (pAVar2,iVar1,cpu_num_x,iVar3,1.0,&pCVar5->values,(GpuVector<double> *)local_40,0.0,
             gpu_y);
  GpuVector<double>::~GpuVector((GpuVector<double> *)local_40);
  return;
}

Assistant:

void GridGlobal::evaluateBatchGPUtempl(T const gpu_x[], int cpu_num_x, T gpu_y[]) const{
    loadGpuValues<T>();
    int num_points = points.getNumIndexes();

    GpuVector<T> gpu_basis(acceleration, cpu_num_x, num_points);
    evaluateHierarchicalFunctionsGPU(gpu_x, cpu_num_x, gpu_basis.data());
    TasGpu::denseMultiply(acceleration, num_outputs, cpu_num_x, num_points, 1.0, getGpuCache<T>()->values, gpu_basis, 0.0, gpu_y);
}